

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O2

int __thiscall
miniros::TransportUDP::connect(TransportUDP *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  addrinfo *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  in_addr_t iVar5;
  in_addr iVar6;
  ostream *poVar7;
  undefined7 extraout_var;
  char *pcVar8;
  Level LVar9;
  ushort uVar10;
  undefined4 in_register_00000034;
  string *host;
  void *pvVar11;
  addrinfo **__pai;
  ulong uVar12;
  allocator<char> local_201;
  string local_200;
  addrinfo *addr;
  sockaddr_in sin;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  char *local_198;
  addrinfo *paStack_190;
  
  host = (string *)CONCAT44(in_register_00000034,__fd);
  uVar12 = (ulong)__addr & 0xffffffff;
  bVar3 = Transport::isHostAllowed(&this->super_Transport,host);
  if (bVar3) {
    iVar4 = socket(2,2,0);
    this->sock_ = iVar4;
    this->connection_id_ = __len;
    if (iVar4 == -1) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (connect::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"miniros.transport_udp",(allocator<char> *)&local_200);
        console::initializeLogLocation(&connect::loc,(string *)&ss,Error);
        std::__cxx11::string::~string((string *)&ss);
      }
      if (connect::loc.level_ != Error) {
        console::setLogLocationLevel(&connect::loc,Error);
        console::checkLogLocationEnabled(&connect::loc);
      }
      pvVar11 = connect::loc.logger_;
      LVar9 = connect::loc.level_;
      if (connect::loc.logger_enabled_ == true) {
        pcVar8 = last_socket_error_string();
        console::print((FilterBase *)0x0,pvVar11,LVar9,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                       ,0xa1,"bool miniros::TransportUDP::connect(const std::string &, int, int)",
                       "socket() failed with error [%s]",pcVar8);
        return 0;
      }
    }
    else {
      sin.sin_zero[0] = '\0';
      sin.sin_zero[1] = '\0';
      sin.sin_zero[2] = '\0';
      sin.sin_zero[3] = '\0';
      sin.sin_zero[4] = '\0';
      sin.sin_zero[5] = '\0';
      sin.sin_zero[6] = '\0';
      sin.sin_zero[7] = '\0';
      sin.sin_family = 2;
      sin.sin_port = 0;
      sin.sin_addr.s_addr = 0;
      iVar5 = inet_addr((host->_M_dataplus)._M_p);
      uVar10 = (ushort)uVar12;
      if (iVar5 == 0xffffffff) {
        local_198 = (char *)0x0;
        paStack_190 = (addrinfo *)0x0;
        local_1a8._M_allocated_capacity = 0;
        local_1a8._8_8_ = (sockaddr *)0x0;
        _ss = (pointer)0x0;
        __pai = (addrinfo **)&addr;
        iVar4 = getaddrinfo((host->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)&ss,__pai);
        if (iVar4 == 0) {
          while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
            if (paVar1->ai_family == 2) {
              memcpy(&sin,paVar1->ai_addr,(ulong)paVar1->ai_addrlen);
              uVar10 = uVar10 << 8 | uVar10 >> 8;
              sin.sin_port = uVar10;
              sin.sin_family = (sa_family_t)paVar1->ai_family;
              freeaddrinfo((addrinfo *)addr);
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_200,"miniros.transport_udp",&local_201);
                console::initializeLogLocation
                          (&connect(std::__cxx11::string_const&,int,int)::loc,&local_200,Debug);
                std::__cxx11::string::~string((string *)&local_200);
              }
              if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
                console::setLogLocationLevel
                          (&connect(std::__cxx11::string_const&,int,int)::loc,Debug);
                console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int,int)::loc)
                ;
              }
              pvVar11 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
              LVar9 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
              if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
                pcVar2 = (host->_M_dataplus)._M_p;
                pcVar8 = inet_ntoa((in_addr)sin.sin_addr.s_addr);
                console::print((FilterBase *)0x0,pvVar11,LVar9,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                               ,0xcc,
                               "bool miniros::TransportUDP::connect(const std::string &, int, int)",
                               "Resolved host [%s] to [%s]",pcVar2,pcVar8);
              }
              goto LAB_002626bf;
            }
            __pai = &paVar1->ai_next;
          }
          freeaddrinfo((addrinfo *)addr);
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"miniros.transport_udp",&local_201);
            console::initializeLogLocation
                      (&connect(std::__cxx11::string_const&,int,int)::loc,&local_200,Error);
            std::__cxx11::string::~string((string *)&local_200);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Error) {
            console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int,int)::loc,Error);
            console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int,int)::loc);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ != true) {
            return 0;
          }
          pcVar8 = "Couldn\'t find an AF_INET address for [%s]\n";
          iVar4 = 200;
          pvVar11 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
          LVar9 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
        }
        else {
          (*(this->super_Transport)._vptr_Transport[8])();
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"miniros.transport_udp",&local_201);
            console::initializeLogLocation
                      (&connect(std::__cxx11::string_const&,int,int)::loc,&local_200,Error);
            std::__cxx11::string::~string((string *)&local_200);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Error) {
            console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int,int)::loc,Error);
            console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int,int)::loc);
          }
          if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ != true) {
            return 0;
          }
          pcVar8 = "couldn\'t resolve host [%s]";
          iVar4 = 0xb1;
          pvVar11 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
          LVar9 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
        }
        console::print((FilterBase *)0x0,pvVar11,LVar9,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                       ,iVar4,"bool miniros::TransportUDP::connect(const std::string &, int, int)",
                       pcVar8,(host->_M_dataplus)._M_p);
      }
      else {
        iVar6.s_addr = inet_addr((host->_M_dataplus)._M_p);
        sin.sin_addr.s_addr = iVar6.s_addr;
        uVar10 = uVar10 << 8 | uVar10 >> 8;
LAB_002626bf:
        sin.sin_port = uVar10;
        iVar4 = ::connect(this->sock_,(sockaddr *)&sin,0x10);
        if (iVar4 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar7 = std::operator<<((ostream *)local_1a8._M_local_buf,(string *)host);
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)__addr);
          poVar7 = std::operator<<(poVar7," on socket ");
          std::ostream::operator<<((ostream *)poVar7,this->sock_);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&this->cached_remote_host_,(string *)&local_200)
          ;
          std::__cxx11::string::~string((string *)&local_200);
          bVar3 = initializeSocket(this);
          if (bVar3) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,"miniros.transport_udp",(allocator<char> *)&addr);
              console::initializeLogLocation
                        (&connect(std::__cxx11::string_const&,int,int)::loc,&local_200,Debug);
              std::__cxx11::string::~string((string *)&local_200);
            }
            if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
              console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int,int)::loc,Debug)
              ;
              console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int,int)::loc);
            }
            if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             connect(std::__cxx11::string_const&,int,int)::loc.logger_,
                             connect(std::__cxx11::string_const&,int,int)::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                             ,0xed,
                             "bool miniros::TransportUDP::connect(const std::string &, int, int)",
                             "Connect succeeded to [%s:%d] on socket [%d]",(host->_M_dataplus)._M_p,
                             uVar12,(ulong)(uint)this->sock_);
            }
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          return (int)CONCAT71(extraout_var,bVar3);
        }
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"miniros.transport_udp",(allocator<char> *)&local_200);
          console::initializeLogLocation
                    (&connect(std::__cxx11::string_const&,int,int)::loc,(string *)&ss,Debug);
          std::__cxx11::string::~string((string *)&ss);
        }
        if (connect(std::__cxx11::string_const&,int,int)::loc.level_ != Debug) {
          console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int,int)::loc,Debug);
          console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int,int)::loc);
        }
        pvVar11 = connect(std::__cxx11::string_const&,int,int)::loc.logger_;
        LVar9 = connect(std::__cxx11::string_const&,int,int)::loc.level_;
        if (connect(std::__cxx11::string_const&,int,int)::loc.logger_enabled_ == true) {
          pcVar2 = (host->_M_dataplus)._M_p;
          pcVar8 = last_socket_error_string();
          console::print((FilterBase *)0x0,pvVar11,LVar9,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                         ,0xd7,"bool miniros::TransportUDP::connect(const std::string &, int, int)",
                         "Connect to udpros host [%s:%d] failed with error [%s]",pcVar2,uVar12,
                         pcVar8);
        }
        (*(this->super_Transport)._vptr_Transport[8])(this);
      }
    }
  }
  return 0;
}

Assistant:

bool TransportUDP::connect(const std::string& host, int port, int connection_id)
{
  if (!isHostAllowed(host))
    return false; // adios amigo

  sock_ = socket(AF_INET, SOCK_DGRAM, 0);
  connection_id_ = connection_id;

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  sockaddr_in sin = {};
  sin.sin_family = AF_INET;
  if (inet_addr(host.c_str()) == INADDR_NONE)
  {
    struct addrinfo* addr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;

    if (getaddrinfo(host.c_str(), NULL, &hints, &addr) != 0)
    {
      close();
      MINIROS_ERROR("couldn't resolve host [%s]", host.c_str());
      return false;
    }

    bool found = false;
    struct addrinfo* it = addr;
    for (; it; it = it->ai_next)
    {
      if (it->ai_family == AF_INET)
      {
        memcpy(&sin, it->ai_addr, it->ai_addrlen);
        sin.sin_family = it->ai_family;
        sin.sin_port = htons(port);

        found = true;
        break;
      }
    }

    freeaddrinfo(addr);

    if (!found)
    {
      MINIROS_ERROR("Couldn't find an AF_INET address for [%s]\n", host.c_str());
      return false;
    }

    MINIROS_DEBUG("Resolved host [%s] to [%s]", host.c_str(), inet_ntoa(sin.sin_addr));
  }
  else
  {
    sin.sin_addr.s_addr = inet_addr(host.c_str()); // already an IP addr
  }

  sin.sin_port = htons(port);

  if (::connect(sock_, (sockaddr *)&sin, sizeof(sin)))
  {
    MINIROS_DEBUG("Connect to udpros host [%s:%d] failed with error [%s]", host.c_str(), port,  last_socket_error_string());
    close();

    return false;
  }

  // from daniel stonier:
#ifdef WIN32
  // This is hackish, but windows fails at recv() if its slow to connect (e.g. happens with wireless)
  // recv() needs to check if its connected or not when its asynchronous?
  Sleep(100);
#endif

  std::stringstream ss;
  ss << host << ":" << port << " on socket " << sock_;
  cached_remote_host_ = ss.str();

  if (!initializeSocket())
  {
    return false;
  }

  MINIROS_DEBUG("Connect succeeded to [%s:%d] on socket [%d]", host.c_str(), port, sock_);

  return true;
}